

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertFunctionPointerCall(GraphBuilder *this,CallInst *callInstruction)

{
  type *node;
  type *node_00;
  Node *node_01;
  pointer ppFVar1;
  NodeSequence NVar2;
  NodeSequence NVar3;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functions;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  dg::getCalledFunctions
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)&local_48,
             *(Value **)(callInstruction + -0x20),(LLVMPointerAnalysis *)this->pointsToAnalysis_);
  node = createNode<(NodeType)8,llvm::CallInst_const*>(callInstruction);
  NVar3.first = &addNode<CallFuncPtrNode>(this,node)->super_Node;
  if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48._M_impl.super__Vector_impl_data._M_start) < 9) {
    if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48._M_impl.super__Vector_impl_data._M_start == 8) {
      NVar2 = insertFunction(this,*local_48._M_impl.super__Vector_impl_data._M_start,callInstruction
                            );
    }
    else {
      NVar2 = buildGeneralCallInstruction(this,callInstruction);
    }
    node_01 = NVar2.second;
    Node::addSuccessor(NVar3.first,NVar2.first);
  }
  else {
    node_00 = createNode<(NodeType)9>();
    node_01 = &addNode<CallReturnNode>(this,node_00)->super_Node;
    for (ppFVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 != local_48._M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
      NVar2 = insertFunction(this,*ppFVar1,callInstruction);
      Node::addSuccessor(NVar3.first,NVar2.first);
      Node::addSuccessor(NVar2.second,node_01);
    }
  }
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&local_48);
  NVar3.second = node_01;
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunctionPointerCall(const CallInst *callInstruction) {
#if LLVM_VERSION_MAJOR >= 8
    auto *calledValue = callInstruction->getCalledOperand();
#else
    auto *calledValue = callInstruction->getCalledValue();
#endif
    auto functions = getCalledFunctions(calledValue, pointsToAnalysis_);

    auto *callFuncPtrNode =
            addNode(createNode<NodeType::CALL_FUNCPTR>(callInstruction));
    Node *returnNode;

    if (functions.size() > 1) {
        returnNode = addNode(createNode<NodeType::CALL_RETURN>());
        for (const auto *function : functions) {
            auto nodeSeq = insertFunction(function, callInstruction);
            callFuncPtrNode->addSuccessor(nodeSeq.first);
            nodeSeq.second->addSuccessor(returnNode);
        }
    } else if (functions.size() == 1) {
        auto nodeSeq = insertFunction(functions.front(), callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    } else {
        auto nodeSeq = buildGeneralCallInstruction(callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    }
    return {callFuncPtrNode, returnNode};
}